

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

string * draco::GetFullPath(string *__return_storage_ptr__,string *input_file_relative_path,
                           string *sibling_file_full_path)

{
  long lVar1;
  long *local_40 [2];
  long local_30 [2];
  
  lVar1 = std::__cxx11::string::find_last_of
                    ((char *)sibling_file_full_path,0x1a397a,0xffffffffffffffff);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_40,(ulong)sibling_file_full_path);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(input_file_relative_path->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath(const std::string &input_file_relative_path,
                        const std::string &sibling_file_full_path) {
  const auto pos = sibling_file_full_path.find_last_of("/\\");
  std::string input_file_full_path;
  if (pos != std::string::npos) {
    input_file_full_path = sibling_file_full_path.substr(0, pos + 1);
  }
  input_file_full_path += input_file_relative_path;
  return input_file_full_path;
}